

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_rowcol_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  __m256i vWH_00;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined8 uVar53;
  uint uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  uint in_ECX;
  int iVar59;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar60 [32];
  long in_stack_00000008;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *t;
  __m256i cond_Jlt;
  __m256i cond_all;
  __m256i cond_max;
  __m256i cond_eq;
  __m256i cond_valid_IJ;
  __m256i cond_valid_J;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIltLimit;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vJLimit;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vN;
  __m256i vOne;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf0;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffe9d0;
  int in_stack_ffffffffffffe9e8;
  int iVar61;
  long lVar62;
  undefined4 in_stack_ffffffffffffe9f8;
  int iVar63;
  int in_stack_ffffffffffffea00;
  int iVar64;
  int local_15e8;
  int local_15e4;
  int local_15d0;
  int local_15cc;
  int local_15b8;
  int local_15b4;
  int local_15a0;
  int local_159c;
  int local_1588;
  int local_1584;
  int local_1570;
  int local_156c;
  int local_1558;
  int local_1554;
  int local_1540;
  int local_153c;
  int local_1528;
  int local_1524;
  int local_1510;
  int local_150c;
  int local_14f8;
  int local_14f4;
  int local_14e0;
  int local_14dc;
  int local_14c8;
  int local_14c4;
  int local_14b0;
  int local_14ac;
  uint local_1480;
  int local_147c;
  short *local_1478;
  short *local_1470;
  ushort *local_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [24];
  undefined8 uStack_1268;
  undefined1 local_1260 [32];
  undefined1 local_1240 [24];
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  ushort local_f96;
  ushort local_f94;
  ushort local_f92;
  int local_f90;
  int local_f8c;
  uint local_f88;
  uint local_f84;
  parasail_result_t *local_f80;
  int16_t *local_f78;
  int16_t *local_f70;
  int16_t *local_f68;
  int16_t *local_f60;
  int16_t *local_f58;
  int16_t *local_f50;
  int16_t *local_f48;
  int local_f3c;
  int local_f38;
  uint local_f34;
  int local_f30;
  int local_f2c;
  int local_f28;
  ushort local_f24;
  ushort local_f20;
  uint local_f1c;
  long local_f18;
  long local_f08;
  parasail_result_t *local_f00;
  ushort local_ef6;
  ushort local_ef4;
  undefined2 local_ef2;
  undefined2 local_ef0;
  undefined2 local_eee;
  undefined2 local_eec;
  ushort local_eea;
  ushort local_ee8;
  ushort local_ee6;
  ushort local_ee4;
  ushort local_ee2;
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  ushort local_dc0;
  ushort local_dbe;
  ushort local_dbc;
  ushort local_dba;
  ushort local_db8;
  ushort local_db6;
  ushort local_db4;
  ushort local_db2;
  ushort local_db0;
  ushort local_dae;
  ushort local_dac;
  ushort local_daa;
  ushort local_da8;
  ushort local_da6;
  ushort local_da4;
  ushort local_da2;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  ushort local_d80;
  ushort local_d7e;
  ushort local_d7c;
  ushort local_d7a;
  ushort local_d78;
  ushort local_d76;
  ushort local_d74;
  ushort local_d72;
  ushort local_d70;
  ushort local_d6e;
  ushort local_d6c;
  ushort local_d6a;
  ushort local_d68;
  ushort local_d66;
  ushort local_d64;
  ushort local_d62;
  undefined1 local_d60 [16];
  undefined1 auStack_d50 [16];
  ushort local_d40;
  ushort local_d3e;
  ushort local_d3c;
  ushort local_d3a;
  ushort local_d38;
  ushort local_d36;
  ushort local_d34;
  ushort local_d32;
  ushort local_d30;
  ushort local_d2e;
  ushort local_d2c;
  ushort local_d2a;
  ushort local_d28;
  ushort local_d26;
  ushort local_d24;
  ushort local_d22;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  ushort local_d00;
  ushort local_cfe;
  ushort local_cfc;
  ushort local_cfa;
  ushort local_cf8;
  ushort local_cf6;
  ushort local_cf4;
  ushort local_cf2;
  ushort local_cf0;
  ushort local_cee;
  ushort local_cec;
  ushort local_cea;
  ushort local_ce8;
  ushort local_ce6;
  ushort local_ce4;
  ushort local_ce2;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  ushort local_cc0;
  ushort local_cbe;
  ushort local_cbc;
  ushort local_cba;
  ushort local_cb8;
  ushort local_cb6;
  ushort local_cb4;
  ushort local_cb2;
  ushort local_cb0;
  ushort local_cae;
  ushort local_cac;
  ushort local_caa;
  ushort local_ca8;
  ushort local_ca6;
  ushort local_ca4;
  ushort local_ca2;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  undefined2 local_c80;
  undefined2 local_c7e;
  undefined2 local_c7c;
  undefined2 local_c7a;
  undefined2 local_c78;
  undefined2 local_c76;
  undefined2 local_c74;
  undefined2 local_c72;
  undefined2 local_c70;
  undefined2 local_c6e;
  undefined2 local_c6c;
  undefined2 local_c6a;
  undefined2 local_c68;
  undefined2 local_c66;
  undefined2 local_c64;
  undefined2 local_c62;
  undefined1 local_c60 [16];
  undefined1 auStack_c50 [16];
  undefined2 local_c40;
  undefined2 local_c3e;
  undefined2 local_c3c;
  undefined2 local_c3a;
  undefined2 local_c38;
  undefined2 local_c36;
  undefined2 local_c34;
  undefined2 local_c32;
  undefined2 local_c30;
  undefined2 local_c2e;
  undefined2 local_c2c;
  undefined2 local_c2a;
  undefined2 local_c28;
  undefined2 local_c26;
  undefined2 local_c24;
  undefined2 local_c22;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined2 local_c00;
  undefined2 local_bfe;
  undefined2 local_bfc;
  undefined2 local_bfa;
  undefined2 local_bf8;
  undefined2 local_bf6;
  undefined2 local_bf4;
  undefined2 local_bf2;
  undefined2 local_bf0;
  undefined2 local_bee;
  undefined2 local_bec;
  undefined2 local_bea;
  undefined2 local_be8;
  undefined2 local_be6;
  undefined2 local_be4;
  undefined2 local_be2;
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined2 local_bc0;
  undefined2 local_bbe;
  undefined2 local_bbc;
  undefined2 local_bba;
  undefined2 local_bb8;
  undefined2 local_bb6;
  undefined2 local_bb4;
  undefined2 local_bb2;
  undefined2 local_bb0;
  undefined2 local_bae;
  undefined2 local_bac;
  undefined2 local_baa;
  undefined2 local_ba8;
  undefined2 local_ba6;
  undefined2 local_ba4;
  undefined2 local_ba2;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  ushort local_b80;
  ushort local_b7e;
  ushort local_b7c;
  ushort local_b7a;
  ushort local_b78;
  ushort local_b76;
  ushort local_b74;
  ushort local_b72;
  ushort local_b70;
  ushort local_b6e;
  ushort local_b6c;
  ushort local_b6a;
  ushort local_b68;
  ushort local_b66;
  ushort local_b64;
  ushort local_b62;
  undefined1 local_b60 [32];
  ushort local_b40;
  ushort local_b3e;
  ushort local_b3c;
  ushort local_b3a;
  ushort local_b38;
  ushort local_b36;
  ushort local_b34;
  ushort local_b32;
  ushort local_b30;
  ushort local_b2e;
  ushort local_b2c;
  ushort local_b2a;
  ushort local_b28;
  ushort local_b26;
  ushort local_b24;
  ushort local_b22;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  ushort local_b00;
  ushort local_afe;
  ushort local_afc;
  ushort local_afa;
  ushort local_af8;
  ushort local_af6;
  ushort local_af4;
  ushort local_af2;
  ushort local_af0;
  ushort local_aee;
  ushort local_aec;
  ushort local_aea;
  ushort local_ae8;
  ushort local_ae6;
  ushort local_ae4;
  ushort local_ae2;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined2 local_ac0;
  undefined2 local_abe;
  undefined2 local_abc;
  undefined2 local_aba;
  undefined2 local_ab8;
  undefined2 local_ab6;
  undefined2 local_ab4;
  undefined2 local_ab2;
  undefined2 local_ab0;
  undefined2 local_aae;
  undefined2 local_aac;
  undefined2 local_aaa;
  undefined2 local_aa8;
  undefined2 local_aa6;
  undefined2 local_aa4;
  undefined2 local_aa2;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined2 local_a80;
  undefined2 local_a7e;
  undefined2 local_a7c;
  undefined2 local_a7a;
  undefined2 local_a78;
  undefined2 local_a76;
  undefined2 local_a74;
  undefined2 local_a72;
  undefined2 local_a70;
  undefined2 local_a6e;
  undefined2 local_a6c;
  undefined2 local_a6a;
  undefined2 local_a68;
  undefined2 local_a66;
  undefined2 local_a64;
  undefined2 local_a62;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_f28 = 0;
  local_f2c = 0;
  local_f30 = 0;
  local_f34 = 0;
  local_f38 = 0;
  local_f3c = 0;
  local_f48 = (int16_t *)0x0;
  local_f50 = (int16_t *)0x0;
  local_f58 = (int16_t *)0x0;
  local_f60 = (int16_t *)0x0;
  local_f68 = (int16_t *)0x0;
  local_f70 = (int16_t *)0x0;
  local_f78 = (int16_t *)0x0;
  local_f80 = (parasail_result_t *)0x0;
  local_f84 = 0;
  local_f88 = 0;
  local_f8c = 0;
  local_f90 = 0;
  local_f92 = 0;
  local_f94 = 0;
  local_f96 = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_diag_avx2_256_16","_s2");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_rowcol_diag_avx2_256_16","s2Len");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_rowcol_diag_avx2_256_16","open");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_rowcol_diag_avx2_256_16","gap");
    local_f00 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_diag_avx2_256_16","matrix");
    local_f00 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_rowcol_diag_avx2_256_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_rowcol_diag_avx2_256_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_f28 = 0x10;
    local_f2c = 0xf;
    local_f30 = 0x1e;
    local_1480 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_1480 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_f34 = local_1480;
    uVar54 = local_f34;
    local_f38 = local_1480 + 0xf;
    local_f3c = in_ECX + 0xf;
    local_f84 = 0;
    local_f88 = 0;
    local_f8c = 0;
    local_f90 = 0;
    local_f20 = (ushort)in_R8D;
    local_f96 = local_f20;
    if (*(int *)(in_stack_00000008 + 0x20) <= (int)-in_R8D) {
      local_f96 = -(short)*(undefined4 *)(in_stack_00000008 + 0x20);
    }
    local_f96 = local_f96 + 0x8001;
    local_f94 = ((ushort)*(undefined4 *)(in_stack_00000008 + 0x1c) ^ 0x7fff) - 1;
    auVar31 = vpinsrw_avx(ZEXT216(local_f96),(uint)local_f96,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,6);
    local_de0 = vpinsrw_avx(auVar31,(uint)local_f96,7);
    auVar31 = vpinsrw_avx(ZEXT216(local_f96),(uint)local_f96,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,6);
    auStack_dd0 = vpinsrw_avx(auVar31,(uint)local_f96,7);
    local_fc0 = local_de0._0_8_;
    uStack_fb8 = local_de0._8_8_;
    uStack_fb0 = auStack_dd0._0_8_;
    uStack_fa8 = auStack_dd0._8_8_;
    auVar31 = vpinsrw_avx(ZEXT216(local_f94),(uint)local_f94,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,6);
    local_da0 = vpinsrw_avx(auVar31,(uint)local_f94,7);
    auVar31 = vpinsrw_avx(ZEXT216(local_f94),(uint)local_f94,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f94,6);
    auStack_d90 = vpinsrw_avx(auVar31,(uint)local_f94,7);
    local_fe0 = local_da0._0_8_;
    uStack_fd8 = local_da0._8_8_;
    uStack_fd0 = auStack_d90._0_8_;
    uStack_fc8 = auStack_d90._8_8_;
    local_1000._16_8_ = auStack_d90._0_8_;
    local_1000._0_16_ = local_da0;
    local_1000._24_8_ = auStack_d90._8_8_;
    local_1020._16_8_ = auStack_dd0._0_8_;
    local_1020._0_16_ = local_de0;
    local_1020._24_8_ = auStack_dd0._8_8_;
    auVar31 = vpinsrw_avx(ZEXT216(local_f96),(uint)local_f96,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,6);
    local_d60 = vpinsrw_avx(auVar31,(uint)local_f96,7);
    auVar31 = vpinsrw_avx(ZEXT216(local_f96),(uint)local_f96,1);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,2);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,3);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,4);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,5);
    auVar31 = vpinsrw_avx(auVar31,(uint)local_f96,6);
    auStack_d50 = vpinsrw_avx(auVar31,(uint)local_f96,7);
    local_1040 = local_d60._0_8_;
    uStack_1038 = local_d60._8_8_;
    uStack_1030 = auStack_d50._0_8_;
    uStack_1028 = auStack_d50._8_8_;
    local_e00 = vpslldq_avx2(ZEXT1632(auStack_d50),0xe);
    auVar36._16_8_ = auStack_d50._0_8_;
    auVar36._0_16_ = local_d60;
    auVar36._24_8_ = auStack_d50._8_8_;
    local_e20 = vpsrldq_avx2(auVar36,2);
    local_1060 = vpor_avx2(local_e00,local_e20);
    local_ee8 = local_f20;
    local_ce2 = local_f20;
    local_ce4 = local_f20;
    local_ce6 = local_f20;
    local_ce8 = local_f20;
    local_cea = local_f20;
    local_cec = local_f20;
    local_cee = local_f20;
    local_cf0 = local_f20;
    local_cf2 = local_f20;
    local_cf4 = local_f20;
    local_cf6 = local_f20;
    local_cf8 = local_f20;
    local_cfa = local_f20;
    local_cfc = local_f20;
    local_cfe = local_f20;
    local_d00 = local_f20;
    auVar31 = vpinsrw_avx(ZEXT216(local_f20),in_R8D & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,6);
    local_d20 = vpinsrw_avx(auVar31,in_R8D & 0xffff,7);
    auVar31 = vpinsrw_avx(ZEXT216(local_f20),in_R8D & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,in_R8D & 0xffff,6);
    auStack_d10 = vpinsrw_avx(auVar31,in_R8D & 0xffff,7);
    local_1080 = local_d20._0_8_;
    uStack_1078 = local_d20._8_8_;
    uStack_1070 = auStack_d10._0_8_;
    uStack_1068 = auStack_d10._8_8_;
    local_f24 = (ushort)in_R9D;
    local_eea = local_f24;
    local_ca2 = local_f24;
    local_ca4 = local_f24;
    local_ca6 = local_f24;
    local_ca8 = local_f24;
    local_caa = local_f24;
    local_cac = local_f24;
    local_cae = local_f24;
    local_cb0 = local_f24;
    local_cb2 = local_f24;
    local_cb4 = local_f24;
    local_cb6 = local_f24;
    local_cb8 = local_f24;
    local_cba = local_f24;
    local_cbc = local_f24;
    local_cbe = local_f24;
    local_cc0 = local_f24;
    auVar31 = vpinsrw_avx(ZEXT216(local_f24),in_R9D & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,6);
    local_ce0 = vpinsrw_avx(auVar31,in_R9D & 0xffff,7);
    auVar31 = vpinsrw_avx(ZEXT216(local_f24),in_R9D & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,in_R9D & 0xffff,6);
    auStack_cd0 = vpinsrw_avx(auVar31,in_R9D & 0xffff,7);
    local_10a0 = local_ce0._0_8_;
    uStack_1098 = local_ce0._8_8_;
    uStack_1090 = auStack_cd0._0_8_;
    uStack_1088 = auStack_cd0._8_8_;
    local_eec = 0;
    local_c62 = 0;
    local_c64 = 0;
    local_c66 = 0;
    local_c68 = 0;
    local_c6a = 0;
    local_c6c = 0;
    local_c6e = 0;
    local_c70 = 0;
    local_c72 = 0;
    local_c74 = 0;
    local_c76 = 0;
    local_c78 = 0;
    local_c7a = 0;
    local_c7c = 0;
    local_c7e = 0;
    local_c80 = 0;
    auVar31 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar31 = vpinsrw_avx(auVar31,0,2);
    auVar31 = vpinsrw_avx(auVar31,0,3);
    auVar31 = vpinsrw_avx(auVar31,0,4);
    auVar31 = vpinsrw_avx(auVar31,0,5);
    auVar31 = vpinsrw_avx(auVar31,0,6);
    local_ca0 = vpinsrw_avx(auVar31,0,7);
    auVar31 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar31 = vpinsrw_avx(auVar31,0,2);
    auVar31 = vpinsrw_avx(auVar31,0,3);
    auVar31 = vpinsrw_avx(auVar31,0,4);
    auVar31 = vpinsrw_avx(auVar31,0,5);
    auVar31 = vpinsrw_avx(auVar31,0,6);
    auStack_c90 = vpinsrw_avx(auVar31,0,7);
    local_10c0 = local_ca0._0_8_;
    uStack_10b8 = local_ca0._8_8_;
    uStack_10b0 = auStack_c90._0_8_;
    uStack_10a8 = auStack_c90._8_8_;
    local_eee = 1;
    local_c22 = 1;
    local_c24 = 1;
    local_c26 = 1;
    local_c28 = 1;
    local_c2a = 1;
    local_c2c = 1;
    local_c2e = 1;
    local_c30 = 1;
    local_c32 = 1;
    local_c34 = 1;
    local_c36 = 1;
    local_c38 = 1;
    local_c3a = 1;
    local_c3c = 1;
    local_c3e = 1;
    local_c40 = 1;
    auVar31 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar31 = vpinsrw_avx(auVar31,1,2);
    auVar31 = vpinsrw_avx(auVar31,1,3);
    auVar31 = vpinsrw_avx(auVar31,1,4);
    auVar31 = vpinsrw_avx(auVar31,1,5);
    auVar31 = vpinsrw_avx(auVar31,1,6);
    local_c60 = vpinsrw_avx(auVar31,1,7);
    auVar31 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar31 = vpinsrw_avx(auVar31,1,2);
    auVar31 = vpinsrw_avx(auVar31,1,3);
    auVar31 = vpinsrw_avx(auVar31,1,4);
    auVar31 = vpinsrw_avx(auVar31,1,5);
    auVar31 = vpinsrw_avx(auVar31,1,6);
    auStack_c50 = vpinsrw_avx(auVar31,1,7);
    local_10e0 = local_c60._0_8_;
    uStack_10d8 = local_c60._8_8_;
    uStack_10d0 = auStack_c50._0_8_;
    uStack_10c8 = auStack_c50._8_8_;
    local_ef0 = 0x10;
    local_be2 = 0x10;
    local_be4 = 0x10;
    local_be6 = 0x10;
    local_be8 = 0x10;
    local_bea = 0x10;
    local_bec = 0x10;
    local_bee = 0x10;
    local_bf0 = 0x10;
    local_bf2 = 0x10;
    local_bf4 = 0x10;
    local_bf6 = 0x10;
    local_bf8 = 0x10;
    local_bfa = 0x10;
    local_bfc = 0x10;
    local_bfe = 0x10;
    local_c00 = 0x10;
    auVar31 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar31 = vpinsrw_avx(auVar31,0x10,2);
    auVar31 = vpinsrw_avx(auVar31,0x10,3);
    auVar31 = vpinsrw_avx(auVar31,0x10,4);
    auVar31 = vpinsrw_avx(auVar31,0x10,5);
    auVar31 = vpinsrw_avx(auVar31,0x10,6);
    local_c20 = vpinsrw_avx(auVar31,0x10,7);
    auVar31 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar31 = vpinsrw_avx(auVar31,0x10,2);
    auVar31 = vpinsrw_avx(auVar31,0x10,3);
    auVar31 = vpinsrw_avx(auVar31,0x10,4);
    auVar31 = vpinsrw_avx(auVar31,0x10,5);
    auVar31 = vpinsrw_avx(auVar31,0x10,6);
    auStack_c10 = vpinsrw_avx(auVar31,0x10,7);
    local_1100 = local_c20._0_8_;
    uStack_10f8 = local_c20._8_8_;
    uStack_10f0 = auStack_c10._0_8_;
    uStack_10e8 = auStack_c10._8_8_;
    local_ef2 = 0xffff;
    local_ba2 = 0xffff;
    local_ba4 = 0xffff;
    local_ba6 = 0xffff;
    local_ba8 = 0xffff;
    local_baa = 0xffff;
    local_bac = 0xffff;
    local_bae = 0xffff;
    local_bb0 = 0xffff;
    local_bb2 = 0xffff;
    local_bb4 = 0xffff;
    local_bb6 = 0xffff;
    local_bb8 = 0xffff;
    local_bba = 0xffff;
    local_bbc = 0xffff;
    local_bbe = 0xffff;
    local_bc0 = 0xffff;
    auVar31 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,0xffff,6);
    local_be0 = vpinsrw_avx(auVar31,0xffff,7);
    auVar31 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,0xffff,6);
    auStack_bd0 = vpinsrw_avx(auVar31,0xffff,7);
    local_1120 = local_be0._0_8_;
    uStack_1118 = local_be0._8_8_;
    uStack_1110 = auStack_bd0._0_8_;
    uStack_1108 = auStack_bd0._8_8_;
    local_a62 = 0;
    local_a64 = 1;
    local_a66 = 2;
    local_a68 = 3;
    local_a6a = 4;
    local_a6c = 5;
    local_a6e = 6;
    local_a70 = 7;
    local_a72 = 8;
    local_a74 = 9;
    local_a76 = 10;
    local_a78 = 0xb;
    local_a7a = 0xc;
    local_a7c = 0xd;
    local_a7e = 0xe;
    local_a80 = 0xf;
    auVar31 = vpinsrw_avx(ZEXT216(0xf),0xe,1);
    auVar31 = vpinsrw_avx(auVar31,0xd,2);
    auVar31 = vpinsrw_avx(auVar31,0xc,3);
    auVar31 = vpinsrw_avx(auVar31,0xb,4);
    auVar31 = vpinsrw_avx(auVar31,10,5);
    auVar31 = vpinsrw_avx(auVar31,9,6);
    local_aa0 = vpinsrw_avx(auVar31,8,7);
    auVar31 = vpinsrw_avx(ZEXT216(7),6,1);
    auVar31 = vpinsrw_avx(auVar31,5,2);
    auVar31 = vpinsrw_avx(auVar31,4,3);
    auVar31 = vpinsrw_avx(auVar31,3,4);
    auVar31 = vpinsrw_avx(auVar31,2,5);
    auVar31 = vpinsrw_avx(auVar31,1,6);
    auStack_a90 = vpinsrw_avx(auVar31,0,7);
    local_1140._16_8_ = auStack_a90._0_8_;
    local_1140._0_16_ = local_aa0;
    local_1140._24_8_ = auStack_a90._8_8_;
    local_aa2 = 0;
    local_aa4 = 0xffff;
    local_aa6 = 0xfffe;
    local_aa8 = 0xfffd;
    local_aaa = 0xfffc;
    local_aac = 0xfffb;
    local_aae = 0xfffa;
    local_ab0 = 0xfff9;
    local_ab2 = 0xfff8;
    local_ab4 = 0xfff7;
    local_ab6 = 0xfff6;
    local_ab8 = 0xfff5;
    local_aba = 0xfff4;
    local_abc = 0xfff3;
    local_abe = 0xfff2;
    local_ac0 = 0xfff1;
    auVar31 = vpinsrw_avx(ZEXT216(0xfff1),0xfff2,1);
    auVar31 = vpinsrw_avx(auVar31,0xfff3,2);
    auVar31 = vpinsrw_avx(auVar31,0xfff4,3);
    auVar31 = vpinsrw_avx(auVar31,0xfff5,4);
    auVar31 = vpinsrw_avx(auVar31,0xfff6,5);
    auVar31 = vpinsrw_avx(auVar31,0xfff7,6);
    local_ae0 = vpinsrw_avx(auVar31,0xfff8,7);
    auVar31 = vpinsrw_avx(ZEXT216(0xfff9),0xfffa,1);
    auVar31 = vpinsrw_avx(auVar31,0xfffb,2);
    auVar31 = vpinsrw_avx(auVar31,0xfffc,3);
    auVar31 = vpinsrw_avx(auVar31,0xfffd,4);
    auVar31 = vpinsrw_avx(auVar31,0xfffe,5);
    auVar31 = vpinsrw_avx(auVar31,0xffff,6);
    auStack_ad0 = vpinsrw_avx(auVar31,0,7);
    local_1160 = local_ae0._0_8_;
    uStack_1158 = local_ae0._8_8_;
    uStack_1150 = auStack_ad0._0_8_;
    uStack_1148 = auStack_ad0._8_8_;
    local_1180._16_8_ = auStack_d50._0_8_;
    local_1180._0_16_ = local_d60;
    local_1180._24_8_ = auStack_d50._8_8_;
    local_11a0._16_8_ = auStack_d50._0_8_;
    local_11a0._0_16_ = local_d60;
    local_11a0._24_8_ = auStack_d50._8_8_;
    local_11c0._16_8_ = auStack_d50._0_8_;
    local_11c0._0_16_ = local_d60;
    local_11c0._24_8_ = auStack_d50._8_8_;
    local_f34._0_2_ = (ushort)local_1480;
    local_ef4 = (ushort)local_f34;
    local_b62 = (ushort)local_f34;
    local_b64 = (ushort)local_f34;
    local_b66 = (ushort)local_f34;
    local_b68 = (ushort)local_f34;
    local_b6a = (ushort)local_f34;
    local_b6c = (ushort)local_f34;
    local_b6e = (ushort)local_f34;
    local_b70 = (ushort)local_f34;
    local_b72 = (ushort)local_f34;
    local_b74 = (ushort)local_f34;
    local_b76 = (ushort)local_f34;
    local_b78 = (ushort)local_f34;
    local_b7a = (ushort)local_f34;
    local_b7c = (ushort)local_f34;
    local_b7e = (ushort)local_f34;
    local_b80 = (ushort)local_f34;
    auVar31 = vpinsrw_avx(ZEXT216((ushort)local_f34),local_1480 & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,6);
    auVar31 = vpinsrw_avx(auVar31,local_1480 & 0xffff,7);
    auVar32 = vpinsrw_avx(ZEXT216((ushort)local_f34),local_1480 & 0xffff,1);
    auVar32 = vpinsrw_avx(auVar32,local_1480 & 0xffff,2);
    auVar32 = vpinsrw_avx(auVar32,local_1480 & 0xffff,3);
    auVar32 = vpinsrw_avx(auVar32,local_1480 & 0xffff,4);
    auVar32 = vpinsrw_avx(auVar32,local_1480 & 0xffff,5);
    auVar32 = vpinsrw_avx(auVar32,local_1480 & 0xffff,6);
    auStack_b90 = vpinsrw_avx(auVar32,local_1480 & 0xffff,7);
    local_ba0._0_8_ = auVar31._0_8_;
    uVar55 = local_ba0._0_8_;
    local_ba0._8_8_ = auVar31._8_8_;
    uVar56 = local_ba0._8_8_;
    uVar57 = auStack_b90._0_8_;
    uVar58 = auStack_b90._8_8_;
    local_f1c._0_2_ = (ushort)in_ECX;
    local_ef6 = (ushort)local_f1c;
    local_b22 = (ushort)local_f1c;
    local_b24 = (ushort)local_f1c;
    local_b26 = (ushort)local_f1c;
    local_b28 = (ushort)local_f1c;
    local_b2a = (ushort)local_f1c;
    local_b2c = (ushort)local_f1c;
    local_b2e = (ushort)local_f1c;
    local_b30 = (ushort)local_f1c;
    local_b32 = (ushort)local_f1c;
    local_b34 = (ushort)local_f1c;
    local_b36 = (ushort)local_f1c;
    local_b38 = (ushort)local_f1c;
    local_b3a = (ushort)local_f1c;
    local_b3c = (ushort)local_f1c;
    local_b3e = (ushort)local_f1c;
    local_b40 = (ushort)local_f1c;
    auVar32 = vpinsrw_avx(ZEXT216((ushort)local_f1c),in_ECX & 0xffff,1);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,2);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,3);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,4);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,5);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,6);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,7);
    auVar33 = vpinsrw_avx(ZEXT216((ushort)local_f1c),in_ECX & 0xffff,1);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,2);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,3);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,4);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,5);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,6);
    auVar33 = vpinsrw_avx(auVar33,in_ECX & 0xffff,7);
    auVar60._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar33;
    auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
    local_f92 = local_f96;
    local_f34 = uVar54;
    local_f1c = in_ECX;
    local_f18 = in_RDX;
    local_f08 = in_RDI;
    local_ee6 = local_f96;
    local_ee4 = local_f94;
    local_ee2 = local_f96;
    local_dc0 = local_f96;
    local_dbe = local_f96;
    local_dbc = local_f96;
    local_dba = local_f96;
    local_db8 = local_f96;
    local_db6 = local_f96;
    local_db4 = local_f96;
    local_db2 = local_f96;
    local_db0 = local_f96;
    local_dae = local_f96;
    local_dac = local_f96;
    local_daa = local_f96;
    local_da8 = local_f96;
    local_da6 = local_f96;
    local_da4 = local_f96;
    local_da2 = local_f96;
    local_d80 = local_f94;
    local_d7e = local_f94;
    local_d7c = local_f94;
    local_d7a = local_f94;
    local_d78 = local_f94;
    local_d76 = local_f94;
    local_d74 = local_f94;
    local_d72 = local_f94;
    local_d70 = local_f94;
    local_d6e = local_f94;
    local_d6c = local_f94;
    local_d6a = local_f94;
    local_d68 = local_f94;
    local_d66 = local_f94;
    local_d64 = local_f94;
    local_d62 = local_f94;
    local_d40 = local_f96;
    local_d3e = local_f96;
    local_d3c = local_f96;
    local_d3a = local_f96;
    local_d38 = local_f96;
    local_d36 = local_f96;
    local_d34 = local_f96;
    local_d32 = local_f96;
    local_d30 = local_f96;
    local_d2e = local_f96;
    local_d2c = local_f96;
    local_d2a = local_f96;
    local_d28 = local_f96;
    local_d26 = local_f96;
    local_d24 = local_f96;
    local_d22 = local_f96;
    local_ba0 = auVar31;
    local_b60 = auVar60;
    local_f80 = parasail_result_new_rowcol1(local_1480,in_ECX);
    if (local_f80 == (parasail_result_t *)0x0) {
      local_f00 = (parasail_result_t *)0x0;
    }
    else {
      local_f80->flag = local_f80->flag | 0x10201004;
      local_f80->flag = local_f80->flag | 0x40000;
      local_f50 = parasail_memalign_int16_t(0x20,(long)(int)(local_f1c + local_f30));
      local_f58 = parasail_memalign_int16_t(0x20,(long)(int)(local_f1c + local_f30));
      local_f60 = parasail_memalign_int16_t(0x20,(long)(int)(local_f1c + local_f30));
      local_f68 = local_f50 + local_f2c;
      local_f70 = local_f58 + local_f2c;
      local_f78 = local_f60 + local_f2c;
      if (local_f50 == (int16_t *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f58 == (int16_t *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else if (local_f60 == (int16_t *)0x0) {
        local_f00 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_f48 = parasail_memalign_int16_t(0x20,(long)(int)(local_f34 + local_f2c));
          if (local_f48 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_f84 = 0; (int)local_f84 < (int)local_f34; local_f84 = local_f84 + 1) {
            local_f48[(int)local_f84] =
                 (int16_t)*(undefined4 *)
                           (*(long *)(in_stack_00000008 + 0x10) +
                           (ulong)*(byte *)(local_f08 + (int)local_f84) * 4);
          }
          for (local_f84 = local_f34; (int)local_f84 < local_f38; local_f84 = local_f84 + 1) {
            local_f48[(int)local_f84] = 0;
          }
        }
        for (local_f88 = 0; (int)local_f88 < (int)local_f1c; local_f88 = local_f88 + 1) {
          local_f68[(int)local_f88] =
               (int16_t)*(undefined4 *)
                         (*(long *)(in_stack_00000008 + 0x10) +
                         (ulong)*(byte *)(local_f18 + (int)local_f88) * 4);
        }
        for (local_f88 = -local_f2c; (int)local_f88 < 0; local_f88 = local_f88 + 1) {
          local_f68[(int)local_f88] = 0;
        }
        for (local_f88 = local_f1c; (int)local_f88 < local_f3c; local_f88 = local_f88 + 1) {
          local_f68[(int)local_f88] = 0;
        }
        for (local_f88 = 0; (int)local_f88 < (int)local_f1c; local_f88 = local_f88 + 1) {
          local_f70[(int)local_f88] = 0;
          local_f78[(int)local_f88] = local_f92;
        }
        for (local_f88 = -local_f2c; (int)local_f88 < 0; local_f88 = local_f88 + 1) {
          local_f70[(int)local_f88] = local_f92;
          local_f78[(int)local_f88] = local_f92;
        }
        for (local_f88 = local_f1c; (int)local_f88 < (int)(local_f1c + local_f2c);
            local_f88 = local_f88 + 1) {
          local_f70[(int)local_f88] = local_f92;
          local_f78[(int)local_f88] = local_f92;
        }
        for (local_f84 = 0; (int)local_f84 < (int)local_f34; local_f84 = local_f28 + local_f84) {
          local_1220 = local_1060;
          _local_1240 = local_1060;
          local_1260._8_8_ = uStack_1038;
          local_1260._0_8_ = local_1040;
          local_1260._16_8_ = uStack_1030;
          local_1260._24_8_ = uStack_1028;
          local_1280._8_8_ = uStack_1038;
          local_1280._0_8_ = local_1040;
          local_1280._16_8_ = uStack_1030;
          uStack_1268 = uStack_1028;
          local_12a0._8_8_ = uStack_1158;
          local_12a0._0_8_ = local_1160;
          local_12a0._16_8_ = uStack_1150;
          local_12a0._24_8_ = uStack_1148;
          lVar16 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14ac = (int)local_f48[(int)local_f84];
          }
          else {
            if ((int)local_f84 < (int)local_f34) {
              local_14b0 = local_f84;
            }
            else {
              local_14b0 = local_f34 - 1;
            }
            local_14ac = local_14b0;
          }
          lVar17 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14c4 = (int)local_f48[(int)(local_f84 + 1)];
          }
          else {
            if ((int)(local_f84 + 1) < (int)local_f34) {
              local_14c8 = local_f84 + 1;
            }
            else {
              local_14c8 = local_f34 - 1;
            }
            local_14c4 = local_14c8;
          }
          lVar18 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14dc = (int)local_f48[(int)(local_f84 + 2)];
          }
          else {
            if ((int)(local_f84 + 2) < (int)local_f34) {
              local_14e0 = local_f84 + 2;
            }
            else {
              local_14e0 = local_f34 - 1;
            }
            local_14dc = local_14e0;
          }
          lVar19 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_14f4 = (int)local_f48[(int)(local_f84 + 3)];
          }
          else {
            if ((int)(local_f84 + 3) < (int)local_f34) {
              local_14f8 = local_f84 + 3;
            }
            else {
              local_14f8 = local_f34 - 1;
            }
            local_14f4 = local_14f8;
          }
          lVar20 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_150c = (int)local_f48[(int)(local_f84 + 4)];
          }
          else {
            if ((int)(local_f84 + 4) < (int)local_f34) {
              local_1510 = local_f84 + 4;
            }
            else {
              local_1510 = local_f34 - 1;
            }
            local_150c = local_1510;
          }
          lVar21 = *(long *)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1524 = (int)local_f48[(int)(local_f84 + 5)];
          }
          else {
            if ((int)(local_f84 + 5) < (int)local_f34) {
              local_1528 = local_f84 + 5;
            }
            else {
              local_1528 = local_f34 - 1;
            }
            local_1524 = local_1528;
          }
          lVar22 = *(long *)(in_stack_00000008 + 8);
          iVar8 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_153c = (int)local_f48[(int)(local_f84 + 6)];
          }
          else {
            if ((int)(local_f84 + 6) < (int)local_f34) {
              local_1540 = local_f84 + 6;
            }
            else {
              local_1540 = local_f34 - 1;
            }
            local_153c = local_1540;
          }
          lVar23 = *(long *)(in_stack_00000008 + 8);
          iVar9 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1554 = (int)local_f48[(int)(local_f84 + 7)];
          }
          else {
            if ((int)(local_f84 + 7) < (int)local_f34) {
              local_1558 = local_f84 + 7;
            }
            else {
              local_1558 = local_f34 - 1;
            }
            local_1554 = local_1558;
          }
          lVar24 = *(long *)(in_stack_00000008 + 8);
          iVar10 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_156c = (int)local_f48[(int)(local_f84 + 8)];
          }
          else {
            if ((int)(local_f84 + 8) < (int)local_f34) {
              local_1570 = local_f84 + 8;
            }
            else {
              local_1570 = local_f34 - 1;
            }
            local_156c = local_1570;
          }
          lVar25 = *(long *)(in_stack_00000008 + 8);
          iVar11 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1584 = (int)local_f48[(int)(local_f84 + 9)];
          }
          else {
            if ((int)(local_f84 + 9) < (int)local_f34) {
              local_1588 = local_f84 + 9;
            }
            else {
              local_1588 = local_f34 - 1;
            }
            local_1584 = local_1588;
          }
          lVar26 = *(long *)(in_stack_00000008 + 8);
          iVar12 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_159c = (int)local_f48[(int)(local_f84 + 10)];
          }
          else {
            if ((int)(local_f84 + 10) < (int)local_f34) {
              local_15a0 = local_f84 + 10;
            }
            else {
              local_15a0 = local_f34 - 1;
            }
            local_159c = local_15a0;
          }
          lVar27 = *(long *)(in_stack_00000008 + 8);
          iVar13 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_15b4 = (int)local_f48[(int)(local_f84 + 0xb)];
          }
          else {
            if ((int)(local_f84 + 0xb) < (int)local_f34) {
              local_15b8 = local_f84 + 0xb;
            }
            else {
              local_15b8 = local_f34 - 1;
            }
            local_15b4 = local_15b8;
          }
          lVar28 = *(long *)(in_stack_00000008 + 8);
          iVar14 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_15cc = (int)local_f48[(int)(local_f84 + 0xc)];
          }
          else {
            if ((int)(local_f84 + 0xc) < (int)local_f34) {
              local_15d0 = local_f84 + 0xc;
            }
            else {
              local_15d0 = local_f34 - 1;
            }
            local_15cc = local_15d0;
          }
          lVar29 = *(long *)(in_stack_00000008 + 8);
          iVar15 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_15e4 = (int)local_f48[(int)(local_f84 + 0xd)];
          }
          else {
            if ((int)(local_f84 + 0xd) < (int)local_f34) {
              local_15e8 = local_f84 + 0xd;
            }
            else {
              local_15e8 = local_f34 - 1;
            }
            local_15e4 = local_15e8;
          }
          lVar30 = *(long *)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar64 = (int)local_f48[(int)(local_f84 + 0xe)];
          }
          else if ((int)(local_f84 + 0xe) < (int)local_f34) {
            in_stack_ffffffffffffea00 = local_f84 + 0xe;
            iVar64 = in_stack_ffffffffffffea00;
          }
          else {
            in_stack_ffffffffffffea00 = local_f34 - 1;
            iVar64 = in_stack_ffffffffffffea00;
          }
          iVar59 = *(int *)(in_stack_00000008 + 0x18) * iVar64;
          lVar62 = *(long *)(in_stack_00000008 + 8);
          iVar63 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar61 = (int)local_f48[(int)(local_f84 + 0xf)];
          }
          else if ((int)(local_f84 + 0xf) < (int)local_f34) {
            in_stack_ffffffffffffe9e8 = local_f84 + 0xf;
            iVar61 = in_stack_ffffffffffffe9e8;
          }
          else {
            in_stack_ffffffffffffe9e8 = local_f34 - 1;
            iVar61 = in_stack_ffffffffffffe9e8;
          }
          lVar1 = lVar62 + (long)(iVar63 * iVar61) * 4;
          local_8c0 = uVar55;
          uStack_8b8 = uVar56;
          uStack_8b0 = uVar57;
          uStack_8a8 = uVar58;
          local_8e0 = local_1140._0_8_;
          uStack_8d8 = local_1140._8_8_;
          uStack_8d0 = local_1140._16_8_;
          uStack_8c8 = local_1140._24_8_;
          auVar34._16_8_ = uVar57;
          auVar34._0_16_ = auVar31;
          auVar34._24_8_ = uVar58;
          auVar36 = vpcmpgtw_avx2(auVar34,local_1140);
          local_f88 = 0;
          while( true ) {
            auVar34 = local_1220;
            uStack_11e8 = auVar60._24_8_;
            uStack_11f0 = auVar60._16_8_;
            if ((int)(local_f1c + local_f2c) <= (int)local_f88) break;
            local_580 = local_1220._0_8_;
            uStack_568 = local_1220._24_8_;
            local_e40 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffedd0),0xe);
            local_e60 = vpsrldq_avx2(_local_1240,2);
            auVar39 = vpor_avx2(local_e40,local_e60);
            local_1220._0_30_ = auVar39._0_30_;
            local_1220._30_2_ = local_f70[(int)local_f88];
            auVar41 = local_1220;
            local_e80 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffed90),0xe);
            local_ea0 = vpsrldq_avx2(_local_1280,2);
            auVar40 = vpor_avx2(local_e80,local_ea0);
            _local_1280 = auVar40._0_30_;
            uStack_1268._6_2_ = local_f78[(int)local_f88];
            auVar38 = _local_1280;
            local_1220._0_8_ = auVar39._0_8_;
            local_1220._8_8_ = auVar39._8_8_;
            local_1220._16_8_ = auVar39._16_8_;
            local_1220._24_8_ = auVar41._24_8_;
            local_640 = local_1220._0_8_;
            uStack_638 = local_1220._8_8_;
            uStack_630 = local_1220._16_8_;
            uStack_628 = local_1220._24_8_;
            local_660 = local_1080;
            uStack_658 = uStack_1078;
            uStack_650 = uStack_1070;
            uStack_648 = uStack_1068;
            auVar47._24_8_ = local_1220._24_8_;
            auVar47._0_24_ = auVar39._0_24_;
            auVar46._8_8_ = uStack_1078;
            auVar46._0_8_ = local_1080;
            auVar46._16_8_ = uStack_1070;
            auVar46._24_8_ = uStack_1068;
            local_740 = vpsubsw_avx2(auVar47,auVar46);
            local_1280._0_8_ = auVar40._0_8_;
            local_1280._8_8_ = auVar40._8_8_;
            local_1280._16_8_ = auVar40._16_8_;
            uStack_1268 = auVar38._24_8_;
            local_680 = local_1280._0_8_;
            uStack_678 = local_1280._8_8_;
            uStack_670 = local_1280._16_8_;
            uStack_668 = uStack_1268;
            local_6a0 = local_10a0;
            uStack_698 = uStack_1098;
            uStack_690 = uStack_1090;
            uStack_688 = uStack_1088;
            auVar45._24_8_ = uStack_1268;
            auVar45._0_24_ = auVar40._0_24_;
            auVar37._8_8_ = uStack_1098;
            auVar37._0_8_ = local_10a0;
            auVar37._16_8_ = uStack_1090;
            auVar37._24_8_ = uStack_1088;
            local_760 = vpsubsw_avx2(auVar45,auVar37);
            auVar39 = vpmaxsw_avx2(local_740,local_760);
            local_6c0 = local_1240._0_8_;
            uStack_6b8 = local_1240._8_8_;
            uStack_6b0 = local_1240._16_8_;
            uStack_6a8 = uStack_1228;
            local_6e0 = local_1080;
            uStack_6d8 = uStack_1078;
            uStack_6d0 = uStack_1070;
            uStack_6c8 = uStack_1068;
            auVar35._8_8_ = uStack_1078;
            auVar35._0_8_ = local_1080;
            auVar35._16_8_ = uStack_1070;
            auVar35._24_8_ = uStack_1068;
            local_780 = vpsubsw_avx2(_local_1240,auVar35);
            local_700 = local_1260._0_8_;
            uStack_6f8 = local_1260._8_8_;
            uStack_6f0 = local_1260._16_8_;
            uStack_6e8 = local_1260._24_8_;
            local_720 = local_10a0;
            uStack_718 = uStack_1098;
            uStack_710 = uStack_1090;
            uStack_708 = uStack_1088;
            auVar40._8_8_ = uStack_1098;
            auVar40._0_8_ = local_10a0;
            auVar40._16_8_ = uStack_1090;
            auVar40._24_8_ = uStack_1088;
            local_7a0 = vpsubsw_avx2(local_1260,auVar40);
            auVar40 = vpmaxsw_avx2(local_780,local_7a0);
            local_ae2 = *(ushort *)
                         (lVar16 + (long)(iVar2 * local_14ac) * 4 +
                         (long)local_f68[(int)local_f88] * 4);
            local_ae4 = *(ushort *)
                         (lVar17 + (long)(iVar3 * local_14c4) * 4 +
                         (long)local_f68[(int)(local_f88 - 1)] * 4);
            local_ae6 = *(ushort *)
                         (lVar18 + (long)(iVar4 * local_14dc) * 4 +
                         (long)local_f68[(int)(local_f88 - 2)] * 4);
            local_ae8 = *(ushort *)
                         (lVar19 + (long)(iVar5 * local_14f4) * 4 +
                         (long)local_f68[(int)(local_f88 - 3)] * 4);
            local_aea = *(ushort *)
                         (lVar20 + (long)(iVar6 * local_150c) * 4 +
                         (long)local_f68[(int)(local_f88 - 4)] * 4);
            local_aec = *(ushort *)
                         (lVar21 + (long)(iVar7 * local_1524) * 4 +
                         (long)local_f68[(int)(local_f88 - 5)] * 4);
            local_aee = *(ushort *)
                         (lVar22 + (long)(iVar8 * local_153c) * 4 +
                         (long)local_f68[(int)(local_f88 - 6)] * 4);
            local_af0 = *(ushort *)
                         (lVar23 + (long)(iVar9 * local_1554) * 4 +
                         (long)local_f68[(int)(local_f88 - 7)] * 4);
            local_af2 = *(ushort *)
                         (lVar24 + (long)(iVar10 * local_156c) * 4 +
                         (long)local_f68[(int)(local_f88 - 8)] * 4);
            local_af4 = *(ushort *)
                         (lVar25 + (long)(iVar11 * local_1584) * 4 +
                         (long)local_f68[(int)(local_f88 - 9)] * 4);
            local_af6 = *(ushort *)
                         (lVar26 + (long)(iVar12 * local_159c) * 4 +
                         (long)local_f68[(int)(local_f88 - 10)] * 4);
            local_af8 = *(ushort *)
                         (lVar27 + (long)(iVar13 * local_15b4) * 4 +
                         (long)local_f68[(int)(local_f88 - 0xb)] * 4);
            local_afa = *(ushort *)
                         (lVar28 + (long)(iVar14 * local_15cc) * 4 +
                         (long)local_f68[(int)(local_f88 - 0xc)] * 4);
            local_afc = *(ushort *)
                         (lVar29 + (long)(iVar15 * local_15e4) * 4 +
                         (long)local_f68[(int)(local_f88 - 0xd)] * 4);
            local_afe = *(ushort *)
                         (lVar30 + (long)iVar59 * 4 + (long)local_f68[(int)(local_f88 - 0xe)] * 4);
            local_b00 = *(ushort *)(lVar1 + (long)local_f68[(int)(local_f88 - 0xf)] * 4);
            auVar32 = vpinsrw_avx(ZEXT216(local_b00),(uint)local_afe,1);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_afc,2);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_afa,3);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_af8,4);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_af6,5);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_af4,6);
            local_b20 = vpinsrw_avx(auVar32,(uint)local_af2,7);
            auVar32 = vpinsrw_avx(ZEXT216(local_af0),(uint)local_aee,1);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_aec,2);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_aea,3);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_ae8,4);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_ae6,5);
            auVar32 = vpinsrw_avx(auVar32,(uint)local_ae4,6);
            auStack_b10 = vpinsrw_avx(auVar32,(uint)local_ae2,7);
            uStack_1378 = auVar34._8_8_;
            uStack_1370 = auVar34._16_8_;
            uStack_578 = uStack_1378;
            uStack_570 = uStack_1370;
            local_5a0 = local_b20._0_8_;
            uStack_598 = local_b20._8_8_;
            uStack_590 = auStack_b10._0_8_;
            uStack_588 = auStack_b10._8_8_;
            auVar49._16_8_ = auStack_b10._0_8_;
            auVar49._0_16_ = local_b20;
            auVar49._24_8_ = auStack_b10._8_8_;
            auVar34 = vpaddsw_avx2(auVar34,auVar49);
            local_1380 = auVar34._0_8_;
            uStack_1378 = auVar34._8_8_;
            uStack_1370 = auVar34._16_8_;
            uStack_1368 = auVar34._24_8_;
            local_1260._0_8_ = auVar40._0_8_;
            local_1260._8_8_ = auVar40._8_8_;
            local_1260._16_8_ = auVar40._16_8_;
            local_1260._24_8_ = auVar40._24_8_;
            local_7c0 = local_1380;
            uStack_7b8 = uStack_1378;
            uStack_7b0 = uStack_1370;
            uStack_7a8 = uStack_1368;
            local_7e0 = local_1260._0_8_;
            uStack_7d8 = local_1260._8_8_;
            uStack_7d0 = local_1260._16_8_;
            uStack_7c8 = local_1260._24_8_;
            auVar34 = vpmaxsw_avx2(auVar34,auVar40);
            local_1240._0_8_ = auVar34._0_8_;
            local_1240._8_8_ = auVar34._8_8_;
            local_1240._16_8_ = auVar34._16_8_;
            uStack_1228 = auVar34._24_8_;
            local_1280._0_8_ = auVar39._0_8_;
            local_1280._8_8_ = auVar39._8_8_;
            local_1280._16_8_ = auVar39._16_8_;
            uStack_1268 = auVar39._24_8_;
            local_800 = local_1240._0_8_;
            uStack_7f8 = local_1240._8_8_;
            uStack_7f0 = local_1240._16_8_;
            uStack_7e8 = uStack_1228;
            local_820 = local_1280._0_8_;
            uStack_818 = local_1280._8_8_;
            uStack_810 = local_1280._16_8_;
            uStack_808 = uStack_1268;
            auVar34 = vpmaxsw_avx2(auVar34,auVar39);
            local_1240._0_8_ = auVar34._0_8_;
            local_1240._8_8_ = auVar34._8_8_;
            local_1240._16_8_ = auVar34._16_8_;
            uStack_1228 = auVar34._24_8_;
            local_840 = local_1240._0_8_;
            uStack_838 = local_1240._8_8_;
            uStack_830 = local_1240._16_8_;
            uStack_828 = uStack_1228;
            local_860 = local_10c0;
            uStack_858 = uStack_10b8;
            uStack_850 = uStack_10b0;
            uStack_848 = uStack_10a8;
            auVar38._8_8_ = uStack_10b8;
            auVar38._0_8_ = local_10c0;
            auVar38._16_8_ = uStack_10b0;
            auVar38._24_8_ = uStack_10a8;
            auVar38 = vpmaxsw_avx2(auVar34,auVar38);
            local_500 = local_12a0._0_8_;
            uStack_4f8 = local_12a0._8_8_;
            uStack_4f0 = local_12a0._16_8_;
            uStack_4e8 = local_12a0._24_8_;
            local_520 = local_1120;
            uStack_518 = uStack_1118;
            uStack_510 = uStack_1110;
            uStack_508 = uStack_1108;
            auVar50._8_8_ = uStack_1118;
            auVar50._0_8_ = local_1120;
            auVar50._16_8_ = uStack_1110;
            auVar50._24_8_ = uStack_1108;
            local_4c0 = vpcmpeqw_avx2(local_12a0,auVar50);
            local_1240._0_8_ = auVar38._0_8_;
            local_1240._8_8_ = auVar38._8_8_;
            local_1240._16_8_ = auVar38._16_8_;
            uStack_1228 = auVar38._24_8_;
            local_4e0 = local_1240._0_8_;
            uStack_4d8 = local_1240._8_8_;
            uStack_4d0 = local_1240._16_8_;
            uStack_4c8 = uStack_1228;
            auVar34 = vpcmpeqd_avx2(local_4c0,local_4c0);
            _local_1240 = vpand_avx2(local_4c0 ^ auVar34,auVar38);
            local_13a0 = local_4c0._0_8_;
            uStack_1398 = local_4c0._8_8_;
            uStack_1390 = local_4c0._16_8_;
            uStack_1388 = local_4c0._24_8_;
            local_220 = local_1280._0_8_;
            uStack_218 = local_1280._8_8_;
            uStack_210 = local_1280._16_8_;
            uStack_208 = uStack_1268;
            local_240 = local_1040;
            uStack_238 = uStack_1038;
            uStack_230 = uStack_1030;
            uStack_228 = uStack_1028;
            local_260 = local_13a0;
            uStack_258 = uStack_1398;
            uStack_250 = uStack_1390;
            uStack_248 = uStack_1388;
            auVar52._8_8_ = uStack_1038;
            auVar52._0_8_ = local_1040;
            auVar52._16_8_ = uStack_1030;
            auVar52._24_8_ = uStack_1028;
            _local_1280 = vpblendvb_avx2(auVar39,auVar52,local_4c0);
            local_280 = local_1260._0_8_;
            uStack_278 = local_1260._8_8_;
            uStack_270 = local_1260._16_8_;
            uStack_268 = local_1260._24_8_;
            local_2a0 = local_1040;
            uStack_298 = uStack_1038;
            uStack_290 = uStack_1030;
            uStack_288 = uStack_1028;
            local_2c0 = local_13a0;
            uStack_2b8 = uStack_1398;
            uStack_2b0 = uStack_1390;
            uStack_2a8 = uStack_1388;
            auVar51._8_8_ = uStack_1038;
            auVar51._0_8_ = local_1040;
            auVar51._16_8_ = uStack_1030;
            auVar51._24_8_ = uStack_1028;
            local_1260 = vpblendvb_avx2(auVar40,auVar51,local_4c0);
            uVar53 = local_1240._0_8_;
            if (local_f2c < (int)local_f88) {
              local_1e0 = local_1000._0_8_;
              uStack_1d8 = local_1000._8_8_;
              uStack_1d0 = local_1000._16_8_;
              uStack_1c8 = local_1000._24_8_;
              local_200 = local_1240._0_8_;
              uStack_1f8 = local_1240._8_8_;
              uStack_1f0 = local_1240._16_8_;
              uStack_1e8 = uStack_1228;
              local_1000 = vpminsw_avx2(local_1000,_local_1240);
              local_880 = local_1020._0_8_;
              uStack_878 = local_1020._8_8_;
              uStack_870 = local_1020._16_8_;
              uStack_868 = local_1020._24_8_;
              local_8a0 = local_1240._0_8_;
              uStack_898 = local_1240._8_8_;
              uStack_890 = local_1240._16_8_;
              uStack_888 = uStack_1228;
              local_1020 = vpmaxsw_avx2(local_1020,_local_1240);
            }
            vWH_00[1]._0_2_ = local_afe;
            vWH_00[0] = lVar1;
            vWH_00[1]._2_2_ = local_ae2;
            vWH_00[1]._4_2_ = local_ae4;
            vWH_00[1]._6_2_ = local_b00;
            vWH_00[2]._0_4_ = in_stack_ffffffffffffe9e8;
            vWH_00[2]._4_4_ = iVar61;
            vWH_00[3] = lVar62;
            arr_store_rowcol((int *)CONCAT44(iVar64,in_stack_ffffffffffffea00),
                             (int *)CONCAT44(iVar63,in_stack_ffffffffffffe9f8),vWH_00,local_f88,
                             in_stack_ffffffffffffe9d0,(int32_t)((ulong)local_f68 >> 0x20),
                             (int32_t)local_f68);
            local_f70[(int)(local_f88 - 0xf)] = local_1240._0_2_;
            local_f78[(int)(local_f88 - 0xf)] = local_1280._0_2_;
            local_900 = local_12a0._0_8_;
            uStack_8f8 = local_12a0._8_8_;
            uStack_8f0 = local_12a0._16_8_;
            uStack_8e8 = local_12a0._24_8_;
            local_920 = local_1120;
            uStack_918 = uStack_1118;
            uStack_910 = uStack_1110;
            uStack_908 = uStack_1108;
            auVar44._8_8_ = uStack_1118;
            auVar44._0_8_ = local_1120;
            auVar44._16_8_ = uStack_1110;
            auVar44._24_8_ = uStack_1108;
            local_a0 = vpcmpgtw_avx2(local_12a0,auVar44);
            uStack_930 = uStack_11f0;
            uStack_928 = uStack_11e8;
            local_960 = local_12a0._0_8_;
            uStack_958 = local_12a0._8_8_;
            uStack_950 = local_12a0._16_8_;
            uStack_948 = local_12a0._24_8_;
            auVar43._16_8_ = uStack_11f0;
            auVar43._0_16_ = auVar60._0_16_;
            auVar43._24_8_ = uStack_11e8;
            local_c0 = vpcmpgtw_avx2(auVar43,local_12a0);
            auVar34 = vpand_avx2(local_a0,local_c0);
            local_13c0 = auVar34._0_8_;
            local_e0 = local_13c0;
            uStack_13b8 = auVar34._8_8_;
            uStack_d8 = uStack_13b8;
            uStack_13b0 = auVar34._16_8_;
            uStack_d0 = uStack_13b0;
            uStack_13a8 = auVar34._24_8_;
            uStack_c8 = uStack_13a8;
            local_1340 = auVar36._0_8_;
            local_100 = local_1340;
            uStack_1338 = auVar36._8_8_;
            uStack_f8 = uStack_1338;
            uStack_1330 = auVar36._16_8_;
            uStack_f0 = uStack_1330;
            uStack_1328 = auVar36._24_8_;
            uStack_e8 = uStack_1328;
            auVar34 = vpand_avx2(auVar34,auVar36);
            local_540 = uVar53;
            uStack_538 = local_1240._8_8_;
            uStack_530 = local_1240._16_8_;
            uStack_528 = uStack_1228;
            local_560 = local_1180._0_8_;
            uStack_558 = local_1180._8_8_;
            uStack_550 = local_1180._16_8_;
            uStack_548 = local_1180._24_8_;
            auVar35 = vpcmpeqw_avx2(_local_1240,local_1180);
            local_980 = uVar53;
            uStack_978 = local_1240._8_8_;
            uStack_970 = local_1240._16_8_;
            uStack_968 = uStack_1228;
            local_9a0 = local_1180._0_8_;
            uStack_998 = local_1180._8_8_;
            uStack_990 = local_1180._16_8_;
            uStack_988 = local_1180._24_8_;
            auVar39 = vpcmpgtw_avx2(_local_1240,local_1180);
            local_1420 = auVar39._0_8_;
            local_120 = local_1420;
            uStack_1418 = auVar39._8_8_;
            uStack_118 = uStack_1418;
            uStack_1410 = auVar39._16_8_;
            uStack_110 = uStack_1410;
            uStack_1408 = auVar39._24_8_;
            uStack_108 = uStack_1408;
            local_13e0 = auVar34._0_8_;
            local_140 = local_13e0;
            uStack_13d8 = auVar34._8_8_;
            uStack_138 = uStack_13d8;
            uStack_13d0 = auVar34._16_8_;
            uStack_130 = uStack_13d0;
            uStack_13c8 = auVar34._24_8_;
            uStack_128 = uStack_13c8;
            auVar39 = vpand_avx2(auVar39,auVar34);
            local_9c0 = local_11c0._0_8_;
            uStack_9b8 = local_11c0._8_8_;
            uStack_9b0 = local_11c0._16_8_;
            uStack_9a8 = local_11c0._24_8_;
            local_9e0 = local_12a0._0_8_;
            uStack_9d8 = local_12a0._8_8_;
            uStack_9d0 = local_12a0._16_8_;
            uStack_9c8 = local_12a0._24_8_;
            auVar37 = vpcmpgtw_avx2(local_11c0,local_12a0);
            local_2e0 = local_1180._0_8_;
            uStack_2d8 = local_1180._8_8_;
            uStack_2d0 = local_1180._16_8_;
            uStack_2c8 = local_1180._24_8_;
            local_300 = uVar53;
            uStack_2f8 = local_1240._8_8_;
            uStack_2f0 = local_1240._16_8_;
            uStack_2e8 = uStack_1228;
            local_1440 = auVar39._0_8_;
            local_320 = local_1440;
            uStack_1438 = auVar39._8_8_;
            uStack_318 = uStack_1438;
            uStack_1430 = auVar39._16_8_;
            uStack_310 = uStack_1430;
            uStack_1428 = auVar39._24_8_;
            uStack_308 = uStack_1428;
            local_1180 = vpblendvb_avx2(local_1180,_local_1240,auVar39);
            local_340 = local_11a0._0_8_;
            uStack_338 = local_11a0._8_8_;
            uStack_330 = local_11a0._16_8_;
            uStack_328 = local_11a0._24_8_;
            local_360 = local_1140._0_8_;
            uStack_358 = local_1140._8_8_;
            uStack_350 = local_1140._16_8_;
            uStack_348 = local_1140._24_8_;
            local_380 = local_1440;
            uStack_378 = uStack_1438;
            uStack_370 = uStack_1430;
            uStack_368 = uStack_1428;
            auVar40 = vpblendvb_avx2(local_11a0,local_1140,auVar39);
            local_3a0 = local_11c0._0_8_;
            uStack_398 = local_11c0._8_8_;
            uStack_390 = local_11c0._16_8_;
            uStack_388 = local_11c0._24_8_;
            local_3c0 = local_12a0._0_8_;
            uStack_3b8 = local_12a0._8_8_;
            uStack_3b0 = local_12a0._16_8_;
            uStack_3a8 = local_12a0._24_8_;
            local_3e0 = local_1440;
            uStack_3d8 = uStack_1438;
            uStack_3d0 = uStack_1430;
            uStack_3c8 = uStack_1428;
            auVar38 = vpblendvb_avx2(local_11c0,local_12a0,auVar39);
            local_1460 = auVar37._0_8_;
            local_160 = local_1460;
            uStack_1458 = auVar37._8_8_;
            uStack_158 = uStack_1458;
            uStack_1450 = auVar37._16_8_;
            uStack_150 = uStack_1450;
            uStack_1448 = auVar37._24_8_;
            uStack_148 = uStack_1448;
            local_1400 = auVar35._0_8_;
            local_180 = local_1400;
            uStack_13f8 = auVar35._8_8_;
            uStack_178 = uStack_13f8;
            uStack_13f0 = auVar35._16_8_;
            uStack_170 = uStack_13f0;
            uStack_13e8 = auVar35._24_8_;
            uStack_168 = uStack_13e8;
            auVar39 = vpand_avx2(auVar37,auVar35);
            local_1440 = auVar39._0_8_;
            local_1a0 = local_1440;
            uStack_1438 = auVar39._8_8_;
            uStack_198 = uStack_1438;
            uStack_1430 = auVar39._16_8_;
            uStack_190 = uStack_1430;
            uStack_1428 = auVar39._24_8_;
            uStack_188 = uStack_1428;
            local_1c0 = local_13e0;
            uStack_1b8 = uStack_13d8;
            uStack_1b0 = uStack_13d0;
            uStack_1a8 = uStack_13c8;
            auVar34 = vpand_avx2(auVar39,auVar34);
            local_11a0._0_8_ = auVar40._0_8_;
            local_400 = local_11a0._0_8_;
            local_11a0._8_8_ = auVar40._8_8_;
            uStack_3f8 = local_11a0._8_8_;
            local_11a0._16_8_ = auVar40._16_8_;
            uStack_3f0 = local_11a0._16_8_;
            local_11a0._24_8_ = auVar40._24_8_;
            uStack_3e8 = local_11a0._24_8_;
            local_420 = local_1140._0_8_;
            uStack_418 = local_1140._8_8_;
            uStack_410 = local_1140._16_8_;
            uStack_408 = local_1140._24_8_;
            local_1440 = auVar34._0_8_;
            local_440 = local_1440;
            uStack_1438 = auVar34._8_8_;
            uStack_438 = uStack_1438;
            uStack_1430 = auVar34._16_8_;
            uStack_430 = uStack_1430;
            uStack_1428 = auVar34._24_8_;
            uStack_428 = uStack_1428;
            local_11a0 = vpblendvb_avx2(auVar40,local_1140,auVar34);
            local_11c0._0_8_ = auVar38._0_8_;
            local_460 = local_11c0._0_8_;
            local_11c0._8_8_ = auVar38._8_8_;
            uStack_458 = local_11c0._8_8_;
            local_11c0._16_8_ = auVar38._16_8_;
            uStack_450 = local_11c0._16_8_;
            local_11c0._24_8_ = auVar38._24_8_;
            uStack_448 = local_11c0._24_8_;
            local_480 = local_12a0._0_8_;
            uStack_478 = local_12a0._8_8_;
            uStack_470 = local_12a0._16_8_;
            uStack_468 = local_12a0._24_8_;
            local_4a0 = local_1440;
            uStack_498 = uStack_1438;
            uStack_490 = uStack_1430;
            uStack_488 = uStack_1428;
            local_11c0 = vpblendvb_avx2(auVar38,local_12a0,auVar34);
            local_5c0 = local_12a0._0_8_;
            uStack_5b8 = local_12a0._8_8_;
            uStack_5b0 = local_12a0._16_8_;
            uStack_5a8 = local_12a0._24_8_;
            local_5e0 = local_10e0;
            uStack_5d8 = uStack_10d8;
            uStack_5d0 = uStack_10d0;
            uStack_5c8 = uStack_10c8;
            auVar48._8_8_ = uStack_10d8;
            auVar48._0_8_ = local_10e0;
            auVar48._16_8_ = uStack_10d0;
            auVar48._24_8_ = uStack_10c8;
            local_12a0 = vpaddsw_avx2(local_12a0,auVar48);
            local_f88 = local_f88 + 1;
            local_1220 = auVar41;
            local_940 = auVar60._0_16_;
          }
          local_600 = local_1140._0_8_;
          uStack_5f8 = local_1140._8_8_;
          uStack_5f0 = local_1140._16_8_;
          uStack_5e8 = local_1140._24_8_;
          local_620 = local_1100;
          uStack_618 = uStack_10f8;
          uStack_610 = uStack_10f0;
          uStack_608 = uStack_10e8;
          auVar39._8_8_ = uStack_10f8;
          auVar39._0_8_ = local_1100;
          auVar39._16_8_ = uStack_10f0;
          auVar39._24_8_ = uStack_10e8;
          local_1140 = vpaddsw_avx2(local_1140,auVar39);
        }
        local_1468 = (ushort *)local_1180;
        local_1470 = (short *)local_11a0;
        local_1478 = (short *)local_11c0;
        for (local_147c = 0; local_147c < local_f28; local_147c = local_147c + 1) {
          if ((short)local_f96 < (short)*local_1468) {
            local_f96 = *local_1468;
            local_f8c = (int)*local_1470;
            local_f90 = (int)*local_1478;
          }
          else if (*local_1468 == local_f96) {
            if (*local_1478 < local_f90) {
              local_f8c = (int)*local_1470;
              local_f90 = (int)*local_1478;
            }
            else if ((*local_1478 == local_f90) && (*local_1470 < local_f8c)) {
              local_f8c = (int)*local_1470;
              local_f90 = (int)*local_1478;
            }
          }
          local_1468 = local_1468 + 1;
          local_1470 = local_1470 + 1;
          local_1478 = local_1478 + 1;
        }
        local_a00 = local_fc0;
        uStack_9f8 = uStack_fb8;
        uStack_9f0 = uStack_fb0;
        uStack_9e8 = uStack_fa8;
        local_a20 = local_1000._0_8_;
        uStack_a18 = local_1000._8_8_;
        uStack_a10 = local_1000._16_8_;
        uStack_a08 = local_1000._24_8_;
        auVar42._8_8_ = uStack_fb8;
        auVar42._0_8_ = local_fc0;
        auVar42._16_8_ = uStack_fb0;
        auVar42._24_8_ = uStack_fa8;
        local_ec0 = vpcmpgtw_avx2(auVar42,local_1000);
        local_a40 = local_1020._0_8_;
        uStack_a38 = local_1020._8_8_;
        uStack_a30 = local_1020._16_8_;
        uStack_a28 = local_1020._24_8_;
        local_a60 = local_fe0;
        uStack_a58 = uStack_fd8;
        uStack_a50 = uStack_fd0;
        uStack_a48 = uStack_fc8;
        auVar41._8_8_ = uStack_fd8;
        auVar41._0_8_ = local_fe0;
        auVar41._16_8_ = uStack_fd0;
        auVar41._24_8_ = uStack_fc8;
        local_ee0 = vpcmpgtw_avx2(local_1020,auVar41);
        local_80 = vpor_avx2(local_ec0,local_ee0);
        if ((((((((((((((((((((((((((((((((local_80 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_80 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_80 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_80 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_80 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_80 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_80 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_80 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_80 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_80 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_80 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_80 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_80 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_80 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_80 >> 0x7f,0) != '\0') ||
                          (local_80 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_80 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_80 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_80 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_80 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_80 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_80 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_80 >> 0xbf,0) != '\0') ||
                  (local_80 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_80 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_80 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_80 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_80 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_80 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_80 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_80[0x1f] < '\0') {
          local_f80->flag = local_f80->flag | 0x40;
          local_f96 = 0;
          local_f8c = 0;
          local_f90 = 0;
        }
        local_f80->score = (int)(short)local_f96;
        local_f80->end_query = local_f8c;
        local_f80->end_ref = local_f90;
        parasail_free(local_f60);
        parasail_free(local_f58);
        parasail_free(local_f50);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_f48);
        }
        local_f00 = local_f80;
      }
    }
  }
  return local_f00;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}